

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::LoadUncachedHeapArguments(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  OpCode op;
  RegSlot RVar3;
  uint32 lhs;
  uint32 size;
  undefined4 *puVar4;
  Scope *pSVar5;
  Symbol *this_00;
  FunctionBody *this_01;
  PropertyIdArray *propIds_00;
  PropertyIdArray *propIds;
  uint count;
  bool hasRest;
  OpCode opcode;
  RegSlot argumentsLoc;
  Symbol *argSym;
  Scope *scope;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  bVar2 = FuncInfo::GetHasHeapArguments(funcInfo);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x21e,"(funcInfo->GetHasHeapArguments())","funcInfo->GetHasHeapArguments()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = FuncInfo::GetBodyScope(funcInfo);
  if (pSVar5 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x221,"(scope)","scope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = FuncInfo::GetArgumentsSymbol(funcInfo);
  if ((this_00 == (Symbol *)0x0) || (bVar2 = Symbol::IsArguments(this_00), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x223,"(argSym && argSym->IsArguments())","argSym && argSym->IsArguments()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  RVar3 = Symbol::GetLocation(this_00);
  bVar2 = ParseNodeFnc::HasNonSimpleParameterList(funcInfo->root);
  op = LdLetHeapArguments;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    op = LdHeapArguments;
  }
  bVar2 = funcInfo->root->pnodeRest != (ParseNodePtr)0x0;
  lhs = ((uint)funcInfo->inArgsCount + (uint)bVar2) - 1;
  if (lhs == 0) {
    if ((funcInfo->root->pnodeParams != (ParseNodePtr)0x0) || (bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x22e,"(funcInfo->root->pnodeParams == nullptr && !hasRest)",
                         "funcInfo->root->pnodeParams == nullptr && !hasRest");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    bVar2 = NeedScopeObjectForArguments(this,funcInfo,funcInfo->root);
    if ((bVar2) && (funcInfo->frameObjRegister != 0xffffffff)) {
      this_01 = FuncInfo::GetParsedFunctionBody(funcInfo);
      size = UInt32Math::Mul(lhs,4);
      propIds_00 = Js::FunctionBody::AllocatePropertyIdArrayForFormals(this_01,size,lhs,'\0');
      GetFormalArgsArray(this,funcInfo,propIds_00);
    }
  }
  Js::ByteCodeWriter::Reg1(&this->m_writer,op,RVar3);
  RVar3 = Symbol::GetLocation(this_00);
  EmitLocalPropInit(this,RVar3,this_00,funcInfo);
  return;
}

Assistant:

void ByteCodeGenerator::LoadUncachedHeapArguments(FuncInfo *funcInfo)
{
    Assert(funcInfo->GetHasHeapArguments());

    Scope *scope = funcInfo->GetBodyScope();
    Assert(scope);
    Symbol *argSym = funcInfo->GetArgumentsSymbol();
    Assert(argSym && argSym->IsArguments());
    Js::RegSlot argumentsLoc = argSym->GetLocation();


    Js::OpCode opcode = !funcInfo->root->HasNonSimpleParameterList() ? Js::OpCode::LdHeapArguments : Js::OpCode::LdLetHeapArguments;
    bool hasRest = funcInfo->root->pnodeRest != nullptr;
    uint count = funcInfo->inArgsCount + (hasRest ? 1 : 0) - 1;
    if (count == 0)
    {
        // If no formals to function (only "this"), then no need to create the scope object.
        // Leave both the arguments location and the propertyIds location as null.
        Assert(funcInfo->root->pnodeParams == nullptr && !hasRest);
    }
    else if (!NeedScopeObjectForArguments(funcInfo, funcInfo->root))
    {
        // We may not need a scope object for arguments, e.g. strict mode with no eval.
    }
    else if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
    {
        // Pass the frame object and ID array to the runtime, and put the resulting Arguments object
        // at the expected location.
        Js::PropertyIdArray *propIds = funcInfo->GetParsedFunctionBody()->AllocatePropertyIdArrayForFormals(UInt32Math::Mul(count, sizeof(Js::PropertyId)), count, 0);
        GetFormalArgsArray(this, funcInfo, propIds);
    }

    this->m_writer.Reg1(opcode, argumentsLoc);
    EmitLocalPropInit(argSym->GetLocation(), argSym, funcInfo);
}